

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall Js::JSONStringifier::ReadData(JSONStringifier *this,Var value,JSONProperty *prop)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  charcount_t rhs;
  uint32 uVar4;
  undefined4 *puVar5;
  RecyclableObject *this_00;
  JavascriptString *pJVar6;
  double value_00;
  RecyclableObject *local_68;
  TypeId typeId;
  RecyclableObject *valueObj;
  JSONProperty *prop_local;
  Var value_local;
  JSONStringifier *this_local;
  TypeId local_24;
  TypeId typeId_1;
  
  bVar2 = VarIs<Js::RecyclableObject>(value);
  if (bVar2) {
    local_68 = UnsafeVarTo<Js::RecyclableObject>(value);
  }
  else {
    local_68 = (RecyclableObject *)0x0;
  }
  if (local_68 == (RecyclableObject *)0x0) {
    if (value == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    bVar2 = TaggedInt::Is(value);
    if (bVar2) {
      local_24 = TypeIds_FirstNumberType;
    }
    else {
      bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(value);
      if (bVar2) {
        local_24 = TypeIds_Number;
      }
      else {
        this_00 = UnsafeVarTo<Js::RecyclableObject>(value);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        local_24 = RecyclableObject::GetTypeId(this_00);
        if ((0x57 < (int)local_24) && (BVar3 = RecyclableObject::IsExternal(this_00), BVar3 == 0)) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                      "GetTypeId aValue has invalid TypeId");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
      }
    }
    if (local_24 == TypeIds_FirstNumberType) {
      prop->type = Number;
      Memory::WriteBarrierPtr<void>::operator=(&(prop->field_1).numericValue.value,value);
      pJVar6 = ScriptContext::GetIntegerString(this->scriptContext,value);
      Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
                (&(prop->field_1).numericValue.string,pJVar6);
      uVar4 = this->totalStringLength;
      pJVar6 = Memory::WriteBarrierPtr<Js::JavascriptString>::operator->
                         (&(prop->field_1).numericValue.string);
      rhs = JavascriptString::GetLength(pJVar6);
      uVar4 = UInt32Math::Add(uVar4,rhs);
      this->totalStringLength = uVar4;
    }
    else if (local_24 == TypeIds_Number) {
      value_00 = JavascriptNumber::GetValue(value);
      SetNumericProperty(this,value_00,value,prop);
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                  ,0x328,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
      prop->type = Undefined;
    }
  }
  else {
    ReadData(this,local_68,prop);
  }
  return;
}

Assistant:

void
JSONStringifier::ReadData(_In_ Var value, _Out_ JSONProperty* prop)
{
    RecyclableObject* valueObj = JavascriptOperators::TryFromVar<RecyclableObject>(value);
    if (valueObj != nullptr)
    {
        ReadData(valueObj, prop);
        return;
    }

    // If value isn't a RecyclableObject, it must be a tagged number

    TypeId typeId = JavascriptOperators::GetTypeId(value);
    switch (typeId)
    {
    case TypeIds_Integer:
    {
        prop->type = JSONContentType::Number;
        prop->numericValue.value = value;
        prop->numericValue.string = this->scriptContext->GetIntegerString(value);
        this->totalStringLength = UInt32Math::Add(this->totalStringLength, prop->numericValue.string->GetLength());
        return;
    }
#if FLOATVAR
    case TypeIds_Number:
        this->SetNumericProperty(JavascriptNumber::GetValue(value), value, prop);
        return;
#endif
    default:
        Assume(UNREACHED);
        prop->type = JSONContentType::Undefined;
        return;
    }
}